

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::CutpoolPropagation::updateActivityUbChange
          (CutpoolPropagation *this,HighsInt col,double oldbound,double newbound)

{
  double *pdVar1;
  int iVar2;
  HighsCutPool *pHVar3;
  HighsDomain *pHVar4;
  long lVar5;
  int *piVar6;
  Reason RVar7;
  double dVar8;
  HighsCDouble HVar9;
  HighsCDouble local_58;
  HighsInt local_44;
  double local_40;
  double local_38;
  
  local_44 = col;
  local_40 = oldbound;
  if (oldbound < newbound) {
    pHVar3 = this->cutpool;
    piVar6 = (pHVar3->matrix_).AheadPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + col;
    while (lVar5 = (long)*piVar6, lVar5 != -1) {
      updateThresholdUbChange
                (this->domain,col,newbound,
                 (pHVar3->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5],
                 (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 (pHVar3->matrix_).ARrowindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar5]);
      piVar6 = (pHVar3->matrix_).AnextPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar5;
    }
  }
  pHVar3 = this->cutpool;
  piVar6 = (pHVar3->matrix_).AheadNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + col;
  do {
    lVar5 = (long)*piVar6;
    if (lVar5 == -1) {
LAB_002a00fb:
      if (this->domain->infeasible_ == true) {
        pHVar3 = this->cutpool;
        piVar6 = (pHVar3->matrix_).AheadNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + col;
        while (lVar5 = (long)*piVar6, lVar5 != -1) {
          iVar2 = (pHVar3->matrix_).ARrowindex_.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar5];
          local_58 = computeDelta((pHVar3->matrix_).ARvalue_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar5],newbound,local_40,INFINITY
                                  ,(this->activitycutsinf_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + iVar2);
          HighsCDouble::operator+=
                    ((this->activitycuts_).
                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar2,&local_58);
          if ((this->domain->infeasible_reason).index == iVar2) {
            return;
          }
          piVar6 = (pHVar3->matrix_).AnextNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start + lVar5;
        }
      }
      return;
    }
    iVar2 = (pHVar3->matrix_).ARrowindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    local_38 = (pHVar3->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
    local_58 = computeDelta(local_38,local_40,newbound,INFINITY,
                            (this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start + iVar2);
    HighsCDouble::operator+=
              ((this->activitycuts_).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar2,&local_58);
    if (local_58.hi + local_58.lo <= 0.0) {
      updateThresholdUbChange
                (this->domain,local_44,newbound,local_38,
                 (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar2);
    }
    else {
      if ((this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] == 0) {
        HVar9 = HighsCDouble::operator-
                          ((this->activitycuts_).
                           super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                           super__Vector_impl_data._M_start + iVar2,
                           (this->cutpool->rhs_).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar2]);
        pHVar4 = this->domain;
        dVar8 = HVar9.lo + HVar9.hi;
        pdVar1 = &((pHVar4->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (*pdVar1 <= dVar8 && dVar8 != *pdVar1) {
          pHVar4->infeasible_ = true;
          pHVar4->infeasible_pos =
               (HighsInt)
               ((ulong)((long)(pHVar4->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pHVar4->domchgstack_).
                             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
          RVar7.index = iVar2;
          RVar7.type = this->cutpoolindex;
          pHVar4->infeasible_reason = RVar7;
          goto LAB_002a00fb;
        }
      }
      markPropagateCut(this,iVar2);
    }
    piVar6 = (pHVar3->matrix_).AnextNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
  } while( true );
}

Assistant:

void HighsDomain::CutpoolPropagation::updateActivityUbChange(HighsInt col,
                                                             double oldbound,
                                                             double newbound) {
  assert(!domain->infeasible_);

  if (newbound > oldbound) {
    cutpool->getMatrix().forEachPositiveColumnEntry(
        col, [&](HighsInt row, double val) {
          domain->updateThresholdUbChange(col, newbound, val,
                                          capacityThreshold_[row]);
          return true;
        });
  }

  cutpool->getMatrix().forEachNegativeColumnEntry(
      col, [&](HighsInt row, double val) {
        assert(val < 0);
        HighsCDouble deltamin = computeDelta(val, oldbound, newbound, kHighsInf,
                                             activitycutsinf_[row]);
        activitycuts_[row] += deltamin;

        if (deltamin <= 0) {
          domain->updateThresholdUbChange(col, newbound, val,
                                          capacityThreshold_[row]);
          return true;
        }

        if (activitycutsinf_[row] == 0 &&
            activitycuts_[row] - cutpool->getRhs()[row] >
                domain->mipsolver->mipdata_->feastol) {
          domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
          domain->infeasible_ = true;
          domain->infeasible_pos = domain->domchgstack_.size();
          domain->infeasible_reason = Reason::cut(cutpoolindex, row);
          return false;
        }

        markPropagateCut(row);

        return true;
      });

  if (domain->infeasible_) {
    assert(domain->infeasible_reason.type == cutpoolindex);
    assert(domain->infeasible_reason.index >= 0);
    std::swap(oldbound, newbound);
    cutpool->getMatrix().forEachNegativeColumnEntry(
        col, [&](HighsInt row, double val) {
          assert(val < 0);
          activitycuts_[row] += computeDelta(val, oldbound, newbound, kHighsInf,
                                             activitycutsinf_[row]);

          if (domain->infeasible_reason.index == row) return false;

          return true;
        });
  }
}